

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  Stats *in_RDI;
  vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_> *unaff_retaddr;
  
  in_RDI->m_testsCount = (size_t)&PTR__JunitReporter_0021ef78;
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &in_RDI[5].m_testCaseStats.
              super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &in_RDI[1].m_testCaseStats.
              super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
  ::~vector((vector<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
             *)unaff_retaddr);
  std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::~vector
            (unaff_retaddr);
  Stats::~Stats(in_RDI);
  ReporterConfig::~ReporterConfig((ReporterConfig *)0x1a16ac);
  SharedImpl<Catch::IReporter>::~SharedImpl((SharedImpl<Catch::IReporter> *)0x1a16b6);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}